

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha.c
# Opt level: O0

int rewrite_wrapper_orders(internal_binding_t *binding)

{
  FILE *pFVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char *in_stack_fffffffffffffeb8;
  undefined4 uVar5;
  undefined8 in_stack_fffffffffffffec0;
  undefined8 uVar6;
  undefined4 uVar7;
  char *local_128;
  char *local_108;
  char *local_e8;
  char *local_c8;
  char *local_a8;
  char *local_88;
  char *local_68;
  internal_binding_t *piStack_40;
  int next_priority;
  internal_binding_t *cur;
  int head_priority;
  int hash_result;
  internal_binding_t *head;
  char *pcStack_20;
  int insert_priority;
  char *name;
  internal_binding_t *binding_local;
  
  uVar7 = (undefined4)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  pcStack_20 = binding->user_binding->name;
  name = (char *)binding;
  head._4_4_ = get_priority(binding->associated_binding_table->tool);
  iVar2 = strcmp(pcStack_20,"main");
  pFVar1 = _stderr;
  if ((iVar2 == 0) && (main_wrapped == 0)) {
    if (1 < debug_level) {
      uVar3 = gotcha_gettid();
      uVar4 = getpid();
      local_68 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/ext/gotcha/src/gotcha.c"
                         ,0x2f);
      if (local_68 == (char *)0x0) {
        local_68 = "";
      }
      fprintf(pFVar1,"[%d/%d][%s:%u] - Wrapping main with Gotcha\'s internal wrappers",(ulong)uVar3,
              (ulong)uVar4,local_68 + 1,0x97);
    }
    main_wrapped = 1;
    gotcha_wrap(libc_main_wrappers,1,"gotcha");
    gotcha_wrap(main_wrappers,1,"gotcha");
  }
  pFVar1 = _stderr;
  if (1 < debug_level) {
    uVar3 = gotcha_gettid();
    uVar4 = getpid();
    local_88 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/ext/gotcha/src/gotcha.c"
                       ,0x2f);
    if (local_88 == (char *)0x0) {
      local_88 = "";
    }
    uVar6 = *(undefined8 *)**(undefined8 **)name;
    in_stack_fffffffffffffeb8 = pcStack_20;
    fprintf(pFVar1,
            "[%d/%d][%s:%u] - gotcha_rewrite_wrapper_orders for binding %s in tool %s of priority %d\n"
            ,(ulong)uVar3,(ulong)uVar4,local_88 + 1,0xa2,pcStack_20,uVar6,head._4_4_);
    uVar7 = (undefined4)((ulong)uVar6 >> 0x20);
  }
  iVar2 = lookup_hashtable(&function_hash_table,pcStack_20,(hash_data_t *)&head_priority);
  pFVar1 = _stderr;
  if (iVar2 == 0) {
    iVar2 = get_priority(_head_priority->associated_binding_table->tool);
    pFVar1 = _stderr;
    uVar5 = (undefined4)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
    if (iVar2 < head._4_4_) {
      if (1 < debug_level) {
        uVar3 = gotcha_gettid();
        uVar4 = getpid();
        local_c8 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/ext/gotcha/src/gotcha.c"
                           ,0x2f);
        if (local_c8 == (char *)0x0) {
          local_c8 = "";
        }
        fprintf(pFVar1,
                "[%d/%d][%s:%u] - New binding priority %d is greater than head priority %d, adding to head\n"
                ,(ulong)uVar3,(ulong)uVar4,local_c8 + 1,0xb3,CONCAT44(uVar5,head._4_4_),
                CONCAT44(uVar7,iVar2));
      }
      insert_at_head((internal_binding_t *)name,_head_priority);
      binding_local._4_4_ = 2;
    }
    else {
      for (piStack_40 = _head_priority; piStack_40->next_binding != (internal_binding_t *)0x0;
          piStack_40 = piStack_40->next_binding) {
        iVar2 = get_priority(piStack_40->next_binding->associated_binding_table->tool);
        pFVar1 = _stderr;
        uVar7 = (undefined4)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
        if (2 < debug_level) {
          uVar3 = gotcha_gettid();
          uVar4 = getpid();
          local_e8 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/ext/gotcha/src/gotcha.c"
                             ,0x2f);
          if (local_e8 == (char *)0x0) {
            local_e8 = "";
          }
          in_stack_fffffffffffffeb8 = (char *)CONCAT44(uVar7,head._4_4_);
          fprintf(pFVar1,
                  "[%d/%d][%s:%u] - Comparing binding for new insertion %d to binding for tool %s at %d\n"
                  ,(ulong)uVar3,(ulong)uVar4,local_e8 + 1,0xc1,in_stack_fffffffffffffeb8,
                  piStack_40->next_binding->associated_binding_table->tool->tool_name,iVar2);
        }
        pFVar1 = _stderr;
        if (iVar2 < head._4_4_) break;
        if (piStack_40->user_binding->wrapper_pointer == *(void **)(*(long *)(name + 8) + 8)) {
          if (2 < debug_level) {
            uVar3 = gotcha_gettid();
            uVar4 = getpid();
            local_108 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/ext/gotcha/src/gotcha.c"
                                ,0x2f);
            if (local_108 == (char *)0x0) {
              local_108 = "";
            }
            fprintf(pFVar1,"[%d/%d][%s:%u] - Tool is already inserted.  Skipping binding rewrite\n",
                    (ulong)uVar3,(ulong)uVar4,local_108 + 1,199);
          }
          return 0;
        }
      }
      pFVar1 = _stderr;
      if (1 < debug_level) {
        uVar3 = gotcha_gettid();
        uVar4 = getpid();
        local_128 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/ext/gotcha/src/gotcha.c"
                            ,0x2f);
        if (local_128 == (char *)0x0) {
          local_128 = "";
        }
        fprintf(pFVar1,"[%d/%d][%s:%u] - Inserting binding after tool %s\n",(ulong)uVar3,
                (ulong)uVar4,local_128 + 1,0xcc,
                piStack_40->associated_binding_table->tool->tool_name);
      }
      insert_after_pos((internal_binding_t *)name,piStack_40);
      binding_local._4_4_ = 0;
    }
  }
  else {
    if (1 < debug_level) {
      uVar3 = gotcha_gettid();
      uVar4 = getpid();
      local_a8 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/ext/gotcha/src/gotcha.c"
                         ,0x2f);
      if (local_a8 == (char *)0x0) {
        local_a8 = "";
      }
      fprintf(pFVar1,"[%d/%d][%s:%u] - Adding new entry for %s to hash table\n",(ulong)uVar3,
              (ulong)uVar4,local_a8 + 1,0xa9,pcStack_20);
    }
    addto_hashtable(&function_hash_table,pcStack_20,name);
    binding_local._4_4_ = 3;
  }
  return binding_local._4_4_;
}

Assistant:

static int rewrite_wrapper_orders(struct internal_binding_t *binding) {
  const char *name = binding->user_binding->name;
  int insert_priority = get_priority(binding->associated_binding_table->tool);

  if (gotcha_strcmp(name, "main") == 0) {
    if (!main_wrapped) {
      debug_printf(2, "Wrapping main with Gotcha's internal wrappers");
      main_wrapped = 1;
      gotcha_wrap(libc_main_wrappers, 1, "gotcha");
      gotcha_wrap(main_wrappers, 1, "gotcha");
    }
  }

  debug_printf(2,
               "gotcha_rewrite_wrapper_orders for binding %s in tool %s of "
               "priority %d\n",
               name, binding->associated_binding_table->tool->tool_name,
               insert_priority);

  struct internal_binding_t *head;
  int hash_result = 0;
  hash_result =
      lookup_hashtable(&function_hash_table, (void *)name, (void **)&head);
  if (hash_result != 0) {
    debug_printf(2, "Adding new entry for %s to hash table\n", name);
    addto_hashtable(&function_hash_table, (void *)name, (void *)binding);
    return (RWO_NEED_LOOKUP | RWO_NEED_BINDING);
  }

  int head_priority = get_priority(head->associated_binding_table->tool);
  if (head_priority < insert_priority) {
    debug_printf(2,
                 "New binding priority %d is greater than head priority %d, "
                 "adding to head\n",
                 insert_priority, head_priority);
    insert_at_head(binding, head);
    return RWO_NEED_BINDING;
  }

  struct internal_binding_t *cur;
  for (cur = head; cur->next_binding; cur = cur->next_binding) {
    int next_priority =
        get_priority(cur->next_binding->associated_binding_table->tool);
    debug_printf(
        3,
        "Comparing binding for new insertion %d to binding for tool %s at %d\n",
        insert_priority,
        cur->next_binding->associated_binding_table->tool->tool_name,
        next_priority);
    if (next_priority < insert_priority) {
      break;
    }
    if (cur->user_binding->wrapper_pointer ==
        binding->user_binding->wrapper_pointer) {
      debug_printf(3, "Tool is already inserted.  Skipping binding rewrite\n");
      return RWO_NOCHANGE;
    }
  }
  debug_printf(2, "Inserting binding after tool %s\n",
               cur->associated_binding_table->tool->tool_name);
  insert_after_pos(binding, cur);
  return RWO_NOCHANGE;
}